

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O3

bool __thiscall
msgpack11::NumberValue<(msgpack11::MsgPack::Type)4,_short>::equals
          (NumberValue<(msgpack11::MsgPack::Type)4,_short> *this,MsgPackValue *other)

{
  bool bVar1;
  int iVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  iVar2 = (*other->_vptr_MsgPackValue[3])(other);
  if (iVar2 - 1U < 10) {
    (*(this->super_Value<(msgpack11::MsgPack::Type)4,_short>).super_MsgPackValue._vptr_MsgPackValue
      [6])(this);
    (*other->_vptr_MsgPackValue[6])(other);
    bVar1 = (bool)(-(extraout_XMM0_Qa_00 == extraout_XMM0_Qa) & 1);
  }
  else {
    iVar2 = (*other->_vptr_MsgPackValue[3])(other);
    if (iVar2 == 4) {
      bVar1 = (this->super_Value<(msgpack11::MsgPack::Type)4,_short>).m_value ==
              *(short *)&other[1]._vptr_MsgPackValue;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool equals(const MsgPackValue * other) const override {
        switch( other->type() )
        {
            case MsgPack::FLOAT32 : // fall through
            case MsgPack::FLOAT64 : // fall through
            case MsgPack::UINT8   : // fall through
            case MsgPack::UINT16  : // fall through
            case MsgPack::UINT32  : // fall through
            case MsgPack::UINT64  : // fall through
            case MsgPack::INT8    : // fall through
            case MsgPack::INT16   : // fall through
            case MsgPack::INT32   : // fall through
            case MsgPack::INT64   : // fall through
            {
                return float64_value() == other->float64_value();
            } break;
            default               :
            {
                return Value<tag,T>::equals( other );
            } break;
        }
    }